

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::resize_bilinear
               (tensor *dest,longlong dest_row_stride,longlong dest_channel_stride,tensor *src,
               longlong src_row_stride,longlong src_channel_stride)

{
  enable_if_t<std::is_convertible<tensor_*,_tensor_*>::value____std::is_convertible<tensor_*,_tensor_*>::value,_bool>
  eVar1;
  ostream *poVar2;
  undefined8 uVar3;
  longlong lVar4;
  longlong lVar5;
  ostream *poVar6;
  string *a;
  size_t sVar7;
  tensor *in_RCX;
  tensor *in_RDI;
  float *d;
  float *s;
  ostringstream dlib_o_out_2;
  ostringstream dlib_o_out_1;
  ostringstream dlib_o_out;
  anon_class_64_8_7869db34 *in_stack_fffffffffffff960;
  long in_stack_fffffffffffff968;
  string *in_stack_fffffffffffff970;
  undefined8 in_stack_fffffffffffff978;
  error_type eVar8;
  fatal_error *in_stack_fffffffffffff980;
  ostringstream local_4f8 [383];
  undefined1 local_379;
  ostringstream local_358 [383];
  undefined1 local_1d9;
  ostringstream local_1a8 [392];
  tensor *local_20;
  tensor *local_8;
  
  eVar8 = (error_type)((ulong)in_stack_fffffffffffff978 >> 0x20);
  local_20 = in_RCX;
  local_8 = in_RDI;
  eVar1 = is_same_object<dlib::tensor,dlib::tensor>(in_RDI,in_RCX);
  if (eVar1) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = std::operator<<((ostream *)local_1a8,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x90c);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_1a8,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_1a8,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::cpu::resize_bilinear(tensor &, long long, long long, const tensor &, long long, long long)"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)local_1a8,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"is_same_object(dest, src)==false");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(local_1a8,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\n");
    local_1d9 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffff980,eVar8,in_stack_fffffffffffff970);
    local_1d9 = 0;
    __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  lVar4 = tensor::num_samples(local_8);
  lVar5 = tensor::num_samples(local_20);
  if (lVar4 == lVar5) {
    lVar4 = tensor::k(local_8);
    lVar5 = tensor::k(local_20);
    if (lVar4 == lVar5) {
      sVar7 = tensor::size(local_8);
      if ((sVar7 != 0) && (sVar7 = tensor::size(local_20), sVar7 != 0)) {
        (*local_20->_vptr_tensor[2])();
        (*local_8->_vptr_tensor[3])();
        lVar4 = tensor::k(local_8);
        tensor::num_samples(local_8);
        parallel_for<dlib::cpu::resize_bilinear(dlib::tensor&,long_long,long_long,dlib::tensor_const&,long_long,long_long)::__0>
                  ((long)in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                   in_stack_fffffffffffff960,lVar4);
      }
      return;
    }
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_4f8);
    poVar2 = std::operator<<((ostream *)local_4f8,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x90e);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_4f8,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_4f8,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::cpu::resize_bilinear(tensor &, long long, long long, const tensor &, long long, long long)"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)local_4f8,"Failing expression was ");
    poVar6 = std::operator<<(poVar2,"dest.k() == src.k()");
    std::operator<<(poVar6,".\n");
    eVar8 = (error_type)((ulong)poVar6 >> 0x20);
    a = (string *)std::ostream::operator<<(local_4f8,std::boolalpha);
    poVar6 = std::operator<<((ostream *)a,"");
    std::operator<<(poVar6,"\n");
    uVar3 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar2,eVar8,a);
    __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream(local_358);
  poVar2 = std::operator<<((ostream *)local_358,"\n\nError detected at line ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x90d);
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)local_358,"Error detected in file ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                          );
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)local_358,"Error detected in function ");
  poVar2 = std::operator<<(poVar2,
                           "void dlib::cpu::resize_bilinear(tensor &, long long, long long, const tensor &, long long, long long)"
                          );
  std::operator<<(poVar2,".\n\n");
  poVar2 = std::operator<<((ostream *)local_358,"Failing expression was ");
  poVar2 = std::operator<<(poVar2,"dest.num_samples() == src.num_samples()");
  std::operator<<(poVar2,".\n");
  poVar2 = (ostream *)std::ostream::operator<<(local_358,std::boolalpha);
  poVar2 = std::operator<<(poVar2,"");
  std::operator<<(poVar2,"\n");
  local_379 = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error(in_stack_fffffffffffff980,eVar8,in_stack_fffffffffffff970);
  local_379 = 0;
  __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void resize_bilinear (
            tensor& dest,
            long long dest_row_stride,
            long long dest_channel_stride,
            const tensor& src,
            long long src_row_stride,
            long long src_channel_stride
        )
        {
            DLIB_CASSERT(is_same_object(dest, src)==false);
            DLIB_CASSERT(dest.num_samples() == src.num_samples());
            DLIB_CASSERT(dest.k() == src.k());

            if (dest.size() == 0 || src.size() == 0)
                return;

            const float* s = src.host();
            float* d = dest.host();

            parallel_for(0, dest.k()*dest.num_samples(), [&](long i)
            {
                auto simg = sub_image(s+i*src_channel_stride, src.nr(), src.nc(), src_row_stride);
                auto dimg = sub_image(d+i*dest_channel_stride, dest.nr(), dest.nc(), dest_row_stride);

                resize_image(simg, dimg);
            });
        }